

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlSBufGrow(xmlSBuf *buf,uint len)

{
  xmlChar *pxVar1;
  uint local_2c;
  uint cap;
  xmlChar *mem;
  uint len_local;
  xmlSBuf *buf_local;
  
  if (len < 0x7fffffff - buf->size) {
    local_2c = (buf->size + len) * 2;
    if (local_2c < 0xf0) {
      local_2c = 0xf0;
    }
    pxVar1 = (xmlChar *)(*xmlRealloc)(buf->mem,(size_t)local_2c);
    if (pxVar1 == (xmlChar *)0x0) {
      buf->code = XML_ERR_NO_MEMORY;
      buf_local._4_4_ = -1;
    }
    else {
      buf->mem = pxVar1;
      buf->cap = local_2c;
      buf_local._4_4_ = 0;
    }
  }
  else {
    if (buf->code == XML_ERR_OK) {
      buf->code = XML_ERR_RESOURCE_LIMIT;
    }
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

static int
xmlSBufGrow(xmlSBuf *buf, unsigned len) {
    xmlChar *mem;
    unsigned cap;

    if (len >= UINT_MAX / 2 - buf->size) {
        if (buf->code == XML_ERR_OK)
            buf->code = XML_ERR_RESOURCE_LIMIT;
        return(-1);
    }

    cap = (buf->size + len) * 2;
    if (cap < 240)
        cap = 240;

    mem = xmlRealloc(buf->mem, cap);
    if (mem == NULL) {
        buf->code = XML_ERR_NO_MEMORY;
        return(-1);
    }

    buf->mem = mem;
    buf->cap = cap;

    return(0);
}